

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_state.cc
# Opt level: O1

vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
* hwtest::pgraph::pgraph_debug_regs
            (vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
             *__return_storage_ptr__,chipset_info *chipset)

{
  int iVar1;
  Register *pRVar2;
  uint32_t uVar3;
  undefined1 *puVar4;
  undefined1 *puVar5;
  _Head_base<0UL,_hwtest::pgraph::Register_*,_false> local_440;
  vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
  *local_438;
  undefined1 *local_430;
  long local_428;
  undefined1 local_420 [16];
  undefined1 *local_410;
  long local_408;
  undefined1 local_400 [16];
  undefined1 *local_3f0;
  long local_3e8;
  undefined1 local_3e0 [16];
  undefined1 *local_3d0;
  long local_3c8;
  undefined1 local_3c0 [16];
  undefined1 *local_3b0;
  long local_3a8;
  undefined1 local_3a0 [16];
  undefined1 *local_390;
  long local_388;
  undefined1 local_380 [16];
  undefined1 *local_370;
  long local_368;
  undefined1 local_360 [16];
  undefined1 *local_350;
  long local_348;
  undefined1 local_340 [16];
  undefined1 *local_330;
  long local_328;
  undefined1 local_320 [16];
  undefined1 *local_310;
  long local_308;
  undefined1 local_300 [16];
  undefined1 *local_2f0;
  long local_2e8;
  undefined1 local_2e0 [16];
  undefined1 *local_2d0;
  long local_2c8;
  undefined1 local_2c0 [16];
  undefined1 *local_2b0;
  long local_2a8;
  undefined1 local_2a0 [16];
  undefined1 *local_290;
  long local_288;
  undefined1 local_280 [16];
  undefined1 *local_270;
  long local_268;
  undefined1 local_260 [16];
  undefined1 *local_250;
  long local_248;
  undefined1 local_240 [16];
  undefined1 *local_230;
  long local_228;
  undefined1 local_220 [16];
  undefined1 *local_210;
  long local_208;
  undefined1 local_200 [16];
  undefined1 *local_1f0;
  long local_1e8;
  undefined1 local_1e0 [16];
  undefined1 *local_1d0;
  long local_1c8;
  undefined1 local_1c0 [16];
  undefined1 *local_1b0;
  long local_1a8;
  undefined1 local_1a0 [16];
  undefined1 *local_190;
  long local_188;
  undefined1 local_180 [16];
  undefined1 *local_170;
  long local_168;
  undefined1 local_160 [16];
  undefined1 *local_150;
  long local_148;
  undefined1 local_140 [16];
  undefined1 *local_130;
  long local_128;
  undefined1 local_120 [16];
  undefined1 *local_110;
  long local_108;
  undefined1 local_100 [16];
  undefined1 *local_f0;
  long local_e8;
  undefined1 local_e0 [16];
  undefined1 *local_d0;
  long local_c8;
  undefined1 local_c0 [16];
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = chipset->card_type;
  if (iVar1 < 0x10) {
    if (iVar1 == 1) {
      pRVar2 = (Register *)operator_new(0x40);
      Nv1DebugARegister::Nv1DebugARegister((Nv1DebugARegister *)pRVar2,0x400080,0x11111110);
      local_440._M_head_impl = pRVar2;
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
      ::
      emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                  *)&local_440);
      if (local_440._M_head_impl != (Register *)0x0) {
        (*(((SimpleMmioRegister *)&(local_440._M_head_impl)->_vptr_Register)->super_MmioRegister).
          super_Register._vptr_Register[1])();
      }
      pRVar2 = (Register *)operator_new(0x40);
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"DEBUG_B","");
      pRVar2->mask = 0x31111101;
      pRVar2->fixed = 0;
      *(undefined4 *)&pRVar2[1]._vptr_Register = 0x400084;
      pRVar2->_vptr_Register = (_func_int **)&PTR__SimpleMmioRegister_00345608;
      *(uint32_t **)&pRVar2[1].mask = &pRVar2[2].mask;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pRVar2[1].mask,local_50,local_50 + local_48);
      pRVar2[3].mask = 0x24;
      pRVar2[3].fixed = 0;
      local_440._M_head_impl = pRVar2;
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
      ::
      emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                  *)&local_440);
      if (local_440._M_head_impl != (Register *)0x0) {
        (*(local_440._M_head_impl)->_vptr_Register[1])();
      }
      local_440._M_head_impl = (Register *)0x0;
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      pRVar2 = (Register *)operator_new(0x40);
      puVar5 = local_60;
      local_70 = puVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"DEBUG_C","");
      pRVar2->mask = 0x11111111;
      pRVar2->fixed = 0;
      *(undefined4 *)&pRVar2[1]._vptr_Register = 0x400088;
      pRVar2->_vptr_Register = (_func_int **)&PTR__SimpleMmioRegister_00345608;
      *(uint32_t **)&pRVar2[1].mask = &pRVar2[2].mask;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pRVar2[1].mask,local_70,local_70 + local_68);
      pRVar2[3].mask = 0x28;
      pRVar2[3].fixed = 0;
      local_440._M_head_impl = pRVar2;
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
      ::
      emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                  *)&local_440);
      puVar4 = local_70;
      if (local_440._M_head_impl != (Register *)0x0) {
        (*(local_440._M_head_impl)->_vptr_Register[1])();
        puVar4 = local_70;
      }
      goto LAB_0017e4a1;
    }
    if (iVar1 == 3) {
      pRVar2 = (Register *)operator_new(0x40);
      Nv1DebugARegister::Nv1DebugARegister((Nv1DebugARegister *)pRVar2,0x400080,0x13311110);
      local_440._M_head_impl = pRVar2;
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
      ::
      emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                  *)&local_440);
      if (local_440._M_head_impl != (Register *)0x0) {
        (*(((SimpleMmioRegister *)&(local_440._M_head_impl)->_vptr_Register)->super_MmioRegister).
          super_Register._vptr_Register[1])();
      }
      pRVar2 = (Register *)operator_new(0x40);
      DebugBRegister::DebugBRegister((DebugBRegister *)pRVar2,0x400084,0x10113301);
      local_440._M_head_impl = pRVar2;
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
      ::
      emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                  *)&local_440);
      if (local_440._M_head_impl != (Register *)0x0) {
        (*(((SimpleMmioRegister *)&(local_440._M_head_impl)->_vptr_Register)->super_MmioRegister).
          super_Register._vptr_Register[1])();
      }
      pRVar2 = (Register *)operator_new(0x40);
      local_90 = local_80;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"DEBUG_C","");
      pRVar2->mask = 0x1133f111;
      pRVar2->fixed = 0;
      *(undefined4 *)&pRVar2[1]._vptr_Register = 0x400088;
      pRVar2->_vptr_Register = (_func_int **)&PTR__SimpleMmioRegister_00345608;
      *(uint32_t **)&pRVar2[1].mask = &pRVar2[2].mask;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pRVar2[1].mask,local_90,local_90 + local_88);
      pRVar2[3].mask = 0x28;
      pRVar2[3].fixed = 0;
      local_440._M_head_impl = pRVar2;
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
      ::
      emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                  *)&local_440);
      if (local_440._M_head_impl != (Register *)0x0) {
        (*(local_440._M_head_impl)->_vptr_Register[1])();
      }
      local_440._M_head_impl = (Register *)0x0;
      if (local_90 != local_80) {
        operator_delete(local_90);
      }
      pRVar2 = (Register *)operator_new(0x40);
      puVar5 = local_a0;
      local_b0 = puVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"DEBUG_D","");
      pRVar2->mask = 0x1173ff31;
      pRVar2->fixed = 0;
      *(undefined4 *)&pRVar2[1]._vptr_Register = 0x40008c;
      pRVar2->_vptr_Register = (_func_int **)&PTR__SimpleMmioRegister_00345608;
      *(uint32_t **)&pRVar2[1].mask = &pRVar2[2].mask;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pRVar2[1].mask,local_b0,local_b0 + local_a8);
      pRVar2[3].mask = 0x2c;
      pRVar2[3].fixed = 0;
      local_440._M_head_impl = pRVar2;
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
      ::
      emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                  *)&local_440);
      puVar4 = local_b0;
      if (local_440._M_head_impl != (Register *)0x0) {
        (*(local_440._M_head_impl)->_vptr_Register[1])();
        puVar4 = local_b0;
      }
      goto LAB_0017e4a1;
    }
    if (iVar1 == 4) {
      iVar1 = chipset->chipset;
      pRVar2 = (Register *)operator_new(0x40);
      Nv4DebugARegister::Nv4DebugARegister((Nv4DebugARegister *)pRVar2,0x400080,0x1337f000);
      local_440._M_head_impl = pRVar2;
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
      ::
      emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                  *)&local_440);
      if (local_440._M_head_impl != (Register *)0x0) {
        (*(((SimpleMmioRegister *)&(local_440._M_head_impl)->_vptr_Register)->super_MmioRegister).
          super_Register._vptr_Register[1])();
      }
      pRVar2 = (Register *)operator_new(0x40);
      uVar3 = 0x72113101;
      if (4 < iVar1) {
        uVar3 = 0xf2ffb701;
      }
      DebugBRegister::DebugBRegister((DebugBRegister *)pRVar2,0x400084,uVar3);
      local_440._M_head_impl = pRVar2;
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
      ::
      emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                  *)&local_440);
      if (local_440._M_head_impl != (Register *)0x0) {
        (*(((SimpleMmioRegister *)&(local_440._M_head_impl)->_vptr_Register)->super_MmioRegister).
          super_Register._vptr_Register[1])();
      }
      pRVar2 = (Register *)operator_new(0x40);
      local_d0 = local_c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"DEBUG_C","");
      pRVar2->mask = 0x11d7fff1;
      pRVar2->fixed = 0;
      *(undefined4 *)&pRVar2[1]._vptr_Register = 0x400088;
      pRVar2->_vptr_Register = (_func_int **)&PTR__SimpleMmioRegister_00345608;
      *(uint32_t **)&pRVar2[1].mask = &pRVar2[2].mask;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pRVar2[1].mask,local_d0,local_d0 + local_c8);
      pRVar2[3].mask = 0x28;
      pRVar2[3].fixed = 0;
      local_440._M_head_impl = pRVar2;
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
      ::
      emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                  *)&local_440);
      if (local_440._M_head_impl != (Register *)0x0) {
        (*(local_440._M_head_impl)->_vptr_Register[1])();
      }
      local_440._M_head_impl = (Register *)0x0;
      if (local_d0 != local_c0) {
        operator_delete(local_d0);
      }
      pRVar2 = (Register *)operator_new(0x40);
      puVar5 = local_e0;
      local_f0 = puVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"DEBUG_D","");
      uVar3 = 0x11ffff33;
      if (4 < iVar1) {
        uVar3 = 0xfbffff73;
      }
      pRVar2->mask = uVar3;
      *(undefined8 *)&pRVar2->fixed = 0x40008c00000000;
      pRVar2->_vptr_Register = (_func_int **)&PTR__SimpleMmioRegister_00345608;
      *(uint32_t **)&pRVar2[1].mask = &pRVar2[2].mask;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pRVar2[1].mask,local_f0,local_f0 + local_e8);
      pRVar2[3].mask = 0x2c;
      pRVar2[3].fixed = 0;
      local_440._M_head_impl = pRVar2;
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
      ::
      emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                  *)&local_440);
      puVar4 = local_f0;
      if (local_440._M_head_impl != (Register *)0x0) {
        (*(local_440._M_head_impl)->_vptr_Register[1])();
        puVar4 = local_f0;
      }
      goto LAB_0017e4a1;
    }
  }
  else {
    if (iVar1 == 0x10) {
      iVar1 = chipset->chipset;
      local_438 = (vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                   *)__return_storage_ptr__;
      if (iVar1 < 0x11 || iVar1 == 0x15) {
        pRVar2 = (Register *)operator_new(0x40);
        DebugBRegister::DebugBRegister((DebugBRegister *)pRVar2,0x400084,0xfe11f701);
        (((SimpleMmioRegister *)&pRVar2->_vptr_Register)->super_MmioRegister).super_Register.
        _vptr_Register = (_func_int **)&PTR__SimpleMmioRegister_00345840;
        local_440._M_head_impl = pRVar2;
        std::
        vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
        ::
        emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                  ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                    *)__return_storage_ptr__,
                   (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                    *)&local_440);
      }
      else {
        pRVar2 = (Register *)operator_new(0x40);
        DebugBRegister::DebugBRegister((DebugBRegister *)pRVar2,0x400084,0xfe71f701);
        (((SimpleMmioRegister *)&pRVar2->_vptr_Register)->super_MmioRegister).super_Register.
        _vptr_Register = (_func_int **)&PTR__SimpleMmioRegister_00345840;
        local_440._M_head_impl = pRVar2;
        std::
        vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
        ::
        emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                  ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                    *)__return_storage_ptr__,
                   (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                    *)&local_440);
      }
      if (local_440._M_head_impl != (Register *)0x0) {
        (*(((SimpleMmioRegister *)&(local_440._M_head_impl)->_vptr_Register)->super_MmioRegister).
          super_Register._vptr_Register[1])();
      }
      pRVar2 = (Register *)operator_new(0x40);
      local_110 = local_100;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"DEBUG_C","");
      pRVar2->mask = 0xffffffff;
      pRVar2->fixed = 0;
      *(undefined4 *)&pRVar2[1]._vptr_Register = 0x400088;
      pRVar2->_vptr_Register = (_func_int **)&PTR__SimpleMmioRegister_00345608;
      *(uint32_t **)&pRVar2[1].mask = &pRVar2[2].mask;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pRVar2[1].mask,local_110,local_110 + local_108);
      pRVar2[3].mask = 0x28;
      pRVar2[3].fixed = 0;
      local_440._M_head_impl = pRVar2;
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
      ::
      emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                (local_438,
                 (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                  *)&local_440);
      if (local_440._M_head_impl != (Register *)0x0) {
        (*(local_440._M_head_impl)->_vptr_Register[1])();
      }
      local_440._M_head_impl = (Register *)0x0;
      if (local_110 != local_100) {
        operator_delete(local_110);
      }
      __return_storage_ptr__ =
           (vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
            *)local_438;
      if (iVar1 < 0x11) {
        pRVar2 = (Register *)operator_new(0x40);
        puVar5 = local_120;
        local_130 = puVar5;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"DEBUG_D","");
        pRVar2->mask = 0xfffffc70;
        pRVar2->fixed = 0;
        *(undefined4 *)&pRVar2[1]._vptr_Register = 0x40008c;
        pRVar2->_vptr_Register = (_func_int **)&PTR__SimpleMmioRegister_00345608;
        *(uint32_t **)&pRVar2[1].mask = &pRVar2[2].mask;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pRVar2[1].mask,local_130,local_130 + local_128);
        pRVar2[3].mask = 0x2c;
        pRVar2[3].fixed = 0;
        local_440._M_head_impl = pRVar2;
        std::
        vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
        ::
        emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                  ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                    *)__return_storage_ptr__,
                   (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                    *)&local_440);
        puVar4 = local_130;
        if (local_440._M_head_impl != (Register *)0x0) {
          (*(local_440._M_head_impl)->_vptr_Register[1])();
          puVar4 = local_130;
        }
      }
      else if (iVar1 < 0x17 || iVar1 == 0x1a) {
        pRVar2 = (Register *)operator_new(0x40);
        puVar5 = local_140;
        local_150 = puVar5;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"DEBUG_D","");
        pRVar2->mask = 0xffffff78;
        pRVar2->fixed = 0;
        *(undefined4 *)&pRVar2[1]._vptr_Register = 0x40008c;
        pRVar2->_vptr_Register = (_func_int **)&PTR__SimpleMmioRegister_00345608;
        *(uint32_t **)&pRVar2[1].mask = &pRVar2[2].mask;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pRVar2[1].mask,local_150,local_150 + local_148);
        pRVar2[3].mask = 0x2c;
        pRVar2[3].fixed = 0;
        local_440._M_head_impl = pRVar2;
        std::
        vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
        ::
        emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                  ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                    *)__return_storage_ptr__,
                   (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                    *)&local_440);
        puVar4 = local_150;
        if (local_440._M_head_impl != (Register *)0x0) {
          (*(local_440._M_head_impl)->_vptr_Register[1])();
          puVar4 = local_150;
        }
      }
      else {
        pRVar2 = (Register *)operator_new(0x40);
        puVar5 = local_160;
        local_170 = puVar5;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"DEBUG_D","");
        pRVar2->mask = 0xffffff78;
        pRVar2->fixed = 0x400;
        *(undefined4 *)&pRVar2[1]._vptr_Register = 0x40008c;
        pRVar2->_vptr_Register = (_func_int **)&PTR__SimpleMmioRegister_00345608;
        *(uint32_t **)&pRVar2[1].mask = &pRVar2[2].mask;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pRVar2[1].mask,local_170,local_170 + local_168);
        pRVar2[3].mask = 0x2c;
        pRVar2[3].fixed = 0;
        local_440._M_head_impl = pRVar2;
        std::
        vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
        ::
        emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                  ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                    *)__return_storage_ptr__,
                   (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                    *)&local_440);
        puVar4 = local_170;
        if (local_440._M_head_impl != (Register *)0x0) {
          (*(local_440._M_head_impl)->_vptr_Register[1])();
          puVar4 = local_170;
        }
      }
      local_440._M_head_impl = (Register *)0x0;
      if (puVar4 != puVar5) {
        operator_delete(puVar4);
      }
      if (iVar1 < 0x17 || iVar1 == 0x1a) {
        pRVar2 = (Register *)operator_new(0x40);
        puVar5 = local_180;
        local_190 = puVar5;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"DEBUG_E","");
        pRVar2->mask = 0xffffff;
        pRVar2->fixed = 0;
        *(undefined4 *)&pRVar2[1]._vptr_Register = 0x400090;
        pRVar2->_vptr_Register = (_func_int **)&PTR__SimpleMmioRegister_00345608;
        *(uint32_t **)&pRVar2[1].mask = &pRVar2[2].mask;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pRVar2[1].mask,local_190,local_190 + local_188);
        pRVar2[3].mask = 0x30;
        pRVar2[3].fixed = 0;
        local_440._M_head_impl = pRVar2;
        std::
        vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
        ::
        emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                  ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                    *)__return_storage_ptr__,
                   (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                    *)&local_440);
        puVar4 = local_190;
        if (local_440._M_head_impl != (Register *)0x0) {
          (*(local_440._M_head_impl)->_vptr_Register[1])();
          puVar4 = local_190;
        }
      }
      else {
        pRVar2 = (Register *)operator_new(0x40);
        puVar5 = local_1a0;
        local_1b0 = puVar5;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"DEBUG_E","");
        pRVar2->mask = 0x1fffffff;
        pRVar2->fixed = 0;
        *(undefined4 *)&pRVar2[1]._vptr_Register = 0x400090;
        pRVar2->_vptr_Register = (_func_int **)&PTR__SimpleMmioRegister_00345608;
        *(uint32_t **)&pRVar2[1].mask = &pRVar2[2].mask;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pRVar2[1].mask,local_1b0,local_1b0 + local_1a8);
        pRVar2[3].mask = 0x30;
        pRVar2[3].fixed = 0;
        local_440._M_head_impl = pRVar2;
        std::
        vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
        ::
        emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                  ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                    *)__return_storage_ptr__,
                   (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                    *)&local_440);
        puVar4 = local_1b0;
        if (local_440._M_head_impl != (Register *)0x0) {
          (*(local_440._M_head_impl)->_vptr_Register[1])();
          puVar4 = local_1b0;
        }
      }
      goto LAB_0017e4a1;
    }
    if (iVar1 == 0x20) {
      iVar1 = chipset->chipset;
      pRVar2 = (Register *)operator_new(0x40);
      DebugBRegister::DebugBRegister((DebugBRegister *)pRVar2,0x400084,0x11f7c1);
      local_440._M_head_impl = pRVar2;
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
      ::
      emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                  *)&local_440);
      if (local_440._M_head_impl != (Register *)0x0) {
        (*(((SimpleMmioRegister *)&(local_440._M_head_impl)->_vptr_Register)->super_MmioRegister).
          super_Register._vptr_Register[1])();
      }
      if (iVar1 < 0x25 || iVar1 == 0x2a) {
        pRVar2 = (Register *)operator_new(0x40);
        local_1d0 = local_1c0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"DEBUG_D","");
        pRVar2->mask = 0xffffd77d;
        pRVar2->fixed = 0;
        *(undefined4 *)&pRVar2[1]._vptr_Register = 0x40008c;
        pRVar2->_vptr_Register = (_func_int **)&PTR__SimpleMmioRegister_00345608;
        *(uint32_t **)&pRVar2[1].mask = &pRVar2[2].mask;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pRVar2[1].mask,local_1d0,local_1d0 + local_1c8);
        pRVar2[3].mask = 0x2c;
        pRVar2[3].fixed = 0;
        local_440._M_head_impl = pRVar2;
        std::
        vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
        ::
        emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                  ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                    *)__return_storage_ptr__,
                   (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                    *)&local_440);
        if (local_440._M_head_impl != (Register *)0x0) {
          (*(local_440._M_head_impl)->_vptr_Register[1])();
        }
        local_440._M_head_impl = (Register *)0x0;
        if (local_1d0 != local_1c0) {
          operator_delete(local_1d0);
        }
        pRVar2 = (Register *)operator_new(0x40);
        local_1f0 = local_1e0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"DEBUG_E","");
        pRVar2->mask = 0xfffff3ff;
        pRVar2->fixed = 0;
        *(undefined4 *)&pRVar2[1]._vptr_Register = 0x400090;
        pRVar2->_vptr_Register = (_func_int **)&PTR__SimpleMmioRegister_00345608;
        *(uint32_t **)&pRVar2[1].mask = &pRVar2[2].mask;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pRVar2[1].mask,local_1f0,local_1f0 + local_1e8);
        pRVar2[3].mask = 0x30;
        pRVar2[3].fixed = 0;
        local_440._M_head_impl = pRVar2;
        std::
        vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
        ::
        emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                  ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                    *)__return_storage_ptr__,
                   (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                    *)&local_440);
        if (local_440._M_head_impl != (Register *)0x0) {
          (*(local_440._M_head_impl)->_vptr_Register[1])();
        }
        local_440._M_head_impl = (Register *)0x0;
        if (local_1f0 != local_1e0) {
          operator_delete(local_1f0);
        }
        pRVar2 = (Register *)operator_new(0x40);
        puVar5 = local_200;
        local_210 = puVar5;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"DEBUG_F","");
        pRVar2->mask = 0xff;
        pRVar2->fixed = 0;
        *(undefined4 *)&pRVar2[1]._vptr_Register = 0x400094;
        pRVar2->_vptr_Register = (_func_int **)&PTR__SimpleMmioRegister_00345608;
        *(uint32_t **)&pRVar2[1].mask = &pRVar2[2].mask;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pRVar2[1].mask,local_210,local_210 + local_208);
        pRVar2[3].mask = 0x34;
        pRVar2[3].fixed = 0;
        local_440._M_head_impl = pRVar2;
        std::
        vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
        ::
        emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                  ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                    *)__return_storage_ptr__,
                   (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                    *)&local_440);
        puVar4 = local_210;
        if (local_440._M_head_impl != (Register *)0x0) {
          (*(local_440._M_head_impl)->_vptr_Register[1])();
          puVar4 = local_210;
        }
      }
      else {
        pRVar2 = (Register *)operator_new(0x40);
        local_230 = local_220;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"DEBUG_D","");
        pRVar2->mask = 0xffffdf7d;
        pRVar2->fixed = 0;
        *(undefined4 *)&pRVar2[1]._vptr_Register = 0x40008c;
        pRVar2->_vptr_Register = (_func_int **)&PTR__SimpleMmioRegister_00345608;
        *(uint32_t **)&pRVar2[1].mask = &pRVar2[2].mask;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pRVar2[1].mask,local_230,local_230 + local_228);
        pRVar2[3].mask = 0x2c;
        pRVar2[3].fixed = 0;
        local_440._M_head_impl = pRVar2;
        std::
        vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
        ::
        emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                  ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                    *)__return_storage_ptr__,
                   (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                    *)&local_440);
        if (local_440._M_head_impl != (Register *)0x0) {
          (*(local_440._M_head_impl)->_vptr_Register[1])();
        }
        local_440._M_head_impl = (Register *)0x0;
        if (local_230 != local_220) {
          operator_delete(local_230);
        }
        pRVar2 = (Register *)operator_new(0x40);
        puVar5 = local_240;
        local_250 = puVar5;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"DEBUG_E","");
        pRVar2->mask = 0xffffffff;
        pRVar2->fixed = 0;
        *(undefined4 *)&pRVar2[1]._vptr_Register = 0x400090;
        pRVar2->_vptr_Register = (_func_int **)&PTR__SimpleMmioRegister_00345608;
        *(uint32_t **)&pRVar2[1].mask = &pRVar2[2].mask;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pRVar2[1].mask,local_250,local_250 + local_248);
        pRVar2[3].mask = 0x30;
        pRVar2[3].fixed = 0;
        local_440._M_head_impl = pRVar2;
        std::
        vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
        ::
        emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                  ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                    *)__return_storage_ptr__,
                   (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                    *)&local_440);
        puVar4 = local_250;
        if (local_440._M_head_impl != (Register *)0x0) {
          (*(local_440._M_head_impl)->_vptr_Register[1])();
          puVar4 = local_250;
        }
      }
      local_440._M_head_impl = (Register *)0x0;
      if (puVar4 != puVar5) {
        operator_delete(puVar4);
      }
      pRVar2 = (Register *)operator_new(0x40);
      local_270 = local_260;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"DEBUG_G","");
      pRVar2->mask = 0xffffffff;
      pRVar2->fixed = 0;
      *(undefined4 *)&pRVar2[1]._vptr_Register = 0x400098;
      pRVar2->_vptr_Register = (_func_int **)&PTR__SimpleMmioRegister_00345608;
      *(uint32_t **)&pRVar2[1].mask = &pRVar2[2].mask;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pRVar2[1].mask,local_270,local_270 + local_268);
      pRVar2[3].mask = 0x38;
      pRVar2[3].fixed = 0;
      local_440._M_head_impl = pRVar2;
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
      ::
      emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                  *)&local_440);
      if (local_440._M_head_impl != (Register *)0x0) {
        (*(local_440._M_head_impl)->_vptr_Register[1])();
      }
      local_440._M_head_impl = (Register *)0x0;
      if (local_270 != local_260) {
        operator_delete(local_270);
      }
      pRVar2 = (Register *)operator_new(0x40);
      local_290 = local_280;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"DEBUG_FD_CHECK_SKIP","")
      ;
      pRVar2->mask = 0xfff;
      pRVar2->fixed = 0;
      *(undefined4 *)&pRVar2[1]._vptr_Register = 0x40009c;
      pRVar2->_vptr_Register = (_func_int **)&PTR__SimpleMmioRegister_00345608;
      *(uint32_t **)&pRVar2[1].mask = &pRVar2[2].mask;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pRVar2[1].mask,local_290,local_290 + local_288);
      pRVar2[3].mask = 0x40;
      pRVar2[3].fixed = 0;
      local_440._M_head_impl = pRVar2;
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
      ::
      emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                  *)&local_440);
      if (local_440._M_head_impl != (Register *)0x0) {
        (*(local_440._M_head_impl)->_vptr_Register[1])();
      }
      local_440._M_head_impl = (Register *)0x0;
      if (local_290 != local_280) {
        operator_delete(local_290);
      }
      if (iVar1 < 0x25 || iVar1 == 0x2a) {
        return __return_storage_ptr__;
      }
      pRVar2 = (Register *)operator_new(0x40);
      puVar5 = local_2a0;
      local_2b0 = puVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"DEBUG_L","");
      pRVar2->mask = 3;
      pRVar2->fixed = 0;
      *(undefined4 *)&pRVar2[1]._vptr_Register = 0x4000c0;
      pRVar2->_vptr_Register = (_func_int **)&PTR__SimpleMmioRegister_00345608;
      *(uint32_t **)&pRVar2[1].mask = &pRVar2[2].mask;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pRVar2[1].mask,local_2b0,local_2b0 + local_2a8);
      pRVar2[3].mask = 0x50;
      pRVar2[3].fixed = 0;
      local_440._M_head_impl = pRVar2;
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
      ::
      emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                  *)&local_440);
      puVar4 = local_2b0;
      if (local_440._M_head_impl != (Register *)0x0) {
        (*(local_440._M_head_impl)->_vptr_Register[1])();
        puVar4 = local_2b0;
      }
      goto LAB_0017e4a1;
    }
    if (iVar1 == 0x30) {
      pRVar2 = (Register *)operator_new(0x40);
      DebugBRegister::DebugBRegister((DebugBRegister *)pRVar2,0x400084,0x7012f7c1);
      local_440._M_head_impl = pRVar2;
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
      ::
      emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                  *)&local_440);
      if (local_440._M_head_impl != (Register *)0x0) {
        (*(((SimpleMmioRegister *)&(local_440._M_head_impl)->_vptr_Register)->super_MmioRegister).
          super_Register._vptr_Register[1])();
      }
      pRVar2 = (Register *)operator_new(0x40);
      local_2d0 = local_2c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"DEBUG_D","");
      pRVar2->mask = 0xfffedf7d;
      pRVar2->fixed = 0;
      *(undefined4 *)&pRVar2[1]._vptr_Register = 0x40008c;
      pRVar2->_vptr_Register = (_func_int **)&PTR__SimpleMmioRegister_00345608;
      *(uint32_t **)&pRVar2[1].mask = &pRVar2[2].mask;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pRVar2[1].mask,local_2d0,local_2d0 + local_2c8);
      pRVar2[3].mask = 0x2c;
      pRVar2[3].fixed = 0;
      local_440._M_head_impl = pRVar2;
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
      ::
      emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                  *)&local_440);
      if (local_440._M_head_impl != (Register *)0x0) {
        (*(local_440._M_head_impl)->_vptr_Register[1])();
      }
      local_440._M_head_impl = (Register *)0x0;
      if (local_2d0 != local_2c0) {
        operator_delete(local_2d0);
      }
      pRVar2 = (Register *)operator_new(0x40);
      local_2f0 = local_2e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"DEBUG_E","");
      pRVar2->mask = 0x3fffffff;
      pRVar2->fixed = 0;
      *(undefined4 *)&pRVar2[1]._vptr_Register = 0x400090;
      pRVar2->_vptr_Register = (_func_int **)&PTR__SimpleMmioRegister_00345608;
      *(uint32_t **)&pRVar2[1].mask = &pRVar2[2].mask;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pRVar2[1].mask,local_2f0,local_2f0 + local_2e8);
      pRVar2[3].mask = 0x30;
      pRVar2[3].fixed = 0;
      local_440._M_head_impl = pRVar2;
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
      ::
      emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                  *)&local_440);
      if (local_440._M_head_impl != (Register *)0x0) {
        (*(local_440._M_head_impl)->_vptr_Register[1])();
      }
      local_440._M_head_impl = (Register *)0x0;
      if (local_2f0 != local_2e0) {
        operator_delete(local_2f0);
      }
      pRVar2 = (Register *)operator_new(0x40);
      local_310 = local_300;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"DEBUG_G","");
      pRVar2->mask = 0xffffffff;
      pRVar2->fixed = 0;
      *(undefined4 *)&pRVar2[1]._vptr_Register = 0x400098;
      pRVar2->_vptr_Register = (_func_int **)&PTR__SimpleMmioRegister_00345608;
      *(uint32_t **)&pRVar2[1].mask = &pRVar2[2].mask;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pRVar2[1].mask,local_310,local_310 + local_308);
      pRVar2[3].mask = 0x38;
      pRVar2[3].fixed = 0;
      local_440._M_head_impl = pRVar2;
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
      ::
      emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                  *)&local_440);
      if (local_440._M_head_impl != (Register *)0x0) {
        (*(local_440._M_head_impl)->_vptr_Register[1])();
      }
      local_440._M_head_impl = (Register *)0x0;
      if (local_310 != local_300) {
        operator_delete(local_310);
      }
      pRVar2 = (Register *)operator_new(0x40);
      local_330 = local_320;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"DEBUG_H","");
      pRVar2->mask = 0xffffffff;
      pRVar2->fixed = 0;
      *(undefined4 *)&pRVar2[1]._vptr_Register = 0x40009c;
      pRVar2->_vptr_Register = (_func_int **)&PTR__SimpleMmioRegister_00345608;
      *(uint32_t **)&pRVar2[1].mask = &pRVar2[2].mask;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pRVar2[1].mask,local_330,local_330 + local_328);
      pRVar2[3].mask = 0x3c;
      pRVar2[3].fixed = 0;
      local_440._M_head_impl = pRVar2;
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
      ::
      emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                  *)&local_440);
      if (local_440._M_head_impl != (Register *)0x0) {
        (*(local_440._M_head_impl)->_vptr_Register[1])();
      }
      local_440._M_head_impl = (Register *)0x0;
      if (local_330 != local_320) {
        operator_delete(local_330);
      }
      pRVar2 = (Register *)operator_new(0x40);
      local_350 = local_340;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"DEBUG_I","");
      pRVar2->mask = 0xffffffff;
      pRVar2->fixed = 0;
      *(undefined4 *)&pRVar2[1]._vptr_Register = 0x4000a0;
      pRVar2->_vptr_Register = (_func_int **)&PTR__SimpleMmioRegister_00345608;
      *(uint32_t **)&pRVar2[1].mask = &pRVar2[2].mask;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pRVar2[1].mask,local_350,local_350 + local_348);
      pRVar2[3].mask = 0x44;
      pRVar2[3].fixed = 0;
      local_440._M_head_impl = pRVar2;
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
      ::
      emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                  *)&local_440);
      if (local_440._M_head_impl != (Register *)0x0) {
        (*(local_440._M_head_impl)->_vptr_Register[1])();
      }
      local_440._M_head_impl = (Register *)0x0;
      if (local_350 != local_340) {
        operator_delete(local_350);
      }
      pRVar2 = (Register *)operator_new(0x40);
      local_370 = local_360;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"DEBUG_J","");
      pRVar2->mask = 0xf;
      pRVar2->fixed = 0;
      *(undefined4 *)&pRVar2[1]._vptr_Register = 0x4000a4;
      pRVar2->_vptr_Register = (_func_int **)&PTR__SimpleMmioRegister_00345608;
      *(uint32_t **)&pRVar2[1].mask = &pRVar2[2].mask;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pRVar2[1].mask,local_370,local_370 + local_368);
      pRVar2[3].mask = 0x48;
      pRVar2[3].fixed = 0;
      local_440._M_head_impl = pRVar2;
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
      ::
      emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                  *)&local_440);
      if (local_440._M_head_impl != (Register *)0x0) {
        (*(local_440._M_head_impl)->_vptr_Register[1])();
      }
      local_440._M_head_impl = (Register *)0x0;
      if (local_370 != local_360) {
        operator_delete(local_370);
      }
      pRVar2 = (Register *)operator_new(0x40);
      puVar5 = local_380;
      local_390 = puVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"DEBUG_L","");
      pRVar2->mask = 0x1e;
      pRVar2->fixed = 0;
      *(undefined4 *)&pRVar2[1]._vptr_Register = 0x4000c0;
      pRVar2->_vptr_Register = (_func_int **)&PTR__SimpleMmioRegister_00345608;
      *(uint32_t **)&pRVar2[1].mask = &pRVar2[2].mask;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pRVar2[1].mask,local_390,local_390 + local_388);
      pRVar2[3].mask = 0x50;
      pRVar2[3].fixed = 0;
      local_440._M_head_impl = pRVar2;
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
      ::
      emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
                ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                  *)&local_440);
      puVar4 = local_390;
      if (local_440._M_head_impl != (Register *)0x0) {
        (*(local_440._M_head_impl)->_vptr_Register[1])();
        puVar4 = local_390;
      }
      goto LAB_0017e4a1;
    }
  }
  pRVar2 = (Register *)operator_new(0x40);
  DebugBRegister::DebugBRegister((DebugBRegister *)pRVar2,0x400084,0x7010c7c1);
  local_440._M_head_impl = pRVar2;
  std::
  vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
  ::
  emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
            ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
              *)__return_storage_ptr__,
             (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> *
             )&local_440);
  if (local_440._M_head_impl != (Register *)0x0) {
    (*(((SimpleMmioRegister *)&(local_440._M_head_impl)->_vptr_Register)->super_MmioRegister).
      super_Register._vptr_Register[1])();
  }
  pRVar2 = (Register *)operator_new(0x40);
  local_3b0 = local_3a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"DEBUG_D","");
  pRVar2->mask = 0xe1fad155;
  pRVar2->fixed = 0;
  *(undefined4 *)&pRVar2[1]._vptr_Register = 0x40008c;
  pRVar2->_vptr_Register = (_func_int **)&PTR__SimpleMmioRegister_00345608;
  *(uint32_t **)&pRVar2[1].mask = &pRVar2[2].mask;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pRVar2[1].mask,local_3b0,local_3b0 + local_3a8);
  pRVar2[3].mask = 0x2c;
  pRVar2[3].fixed = 0;
  local_440._M_head_impl = pRVar2;
  std::
  vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
  ::
  emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
            ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
              *)__return_storage_ptr__,
             (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> *
             )&local_440);
  if (local_440._M_head_impl != (Register *)0x0) {
    (*(local_440._M_head_impl)->_vptr_Register[1])();
  }
  local_440._M_head_impl = (Register *)0x0;
  if (local_3b0 != local_3a0) {
    operator_delete(local_3b0);
  }
  pRVar2 = (Register *)operator_new(0x40);
  local_3d0 = local_3c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"DEBUG_E","");
  pRVar2->mask = 0x33ffffff;
  pRVar2->fixed = 0;
  *(undefined4 *)&pRVar2[1]._vptr_Register = 0x400090;
  pRVar2->_vptr_Register = (_func_int **)&PTR__SimpleMmioRegister_00345608;
  *(uint32_t **)&pRVar2[1].mask = &pRVar2[2].mask;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pRVar2[1].mask,local_3d0,local_3d0 + local_3c8);
  pRVar2[3].mask = 0x30;
  pRVar2[3].fixed = 0;
  local_440._M_head_impl = pRVar2;
  std::
  vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
  ::
  emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
            ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
              *)__return_storage_ptr__,
             (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> *
             )&local_440);
  if (local_440._M_head_impl != (Register *)0x0) {
    (*(local_440._M_head_impl)->_vptr_Register[1])();
  }
  local_440._M_head_impl = (Register *)0x0;
  if (local_3d0 != local_3c0) {
    operator_delete(local_3d0);
  }
  pRVar2 = (Register *)operator_new(0x40);
  local_3f0 = local_3e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"DEBUG_J","");
  pRVar2->mask = 0xf;
  pRVar2->fixed = 0;
  *(undefined4 *)&pRVar2[1]._vptr_Register = 0x4000a4;
  pRVar2->_vptr_Register = (_func_int **)&PTR__SimpleMmioRegister_00345608;
  *(uint32_t **)&pRVar2[1].mask = &pRVar2[2].mask;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pRVar2[1].mask,local_3f0,local_3f0 + local_3e8);
  pRVar2[3].mask = 0x48;
  pRVar2[3].fixed = 0;
  local_440._M_head_impl = pRVar2;
  std::
  vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
  ::
  emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
            ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
              *)__return_storage_ptr__,
             (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> *
             )&local_440);
  if (local_440._M_head_impl != (Register *)0x0) {
    (*(local_440._M_head_impl)->_vptr_Register[1])();
  }
  local_440._M_head_impl = (Register *)0x0;
  if (local_3f0 != local_3e0) {
    operator_delete(local_3f0);
  }
  pRVar2 = (Register *)operator_new(0x40);
  local_410 = local_400;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"DEBUG_K","");
  pRVar2->mask = 0x3f;
  pRVar2->fixed = 0;
  *(undefined4 *)&pRVar2[1]._vptr_Register = 0x4000b0;
  pRVar2->_vptr_Register = (_func_int **)&PTR__SimpleMmioRegister_00345608;
  *(uint32_t **)&pRVar2[1].mask = &pRVar2[2].mask;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pRVar2[1].mask,local_410,local_410 + local_408);
  pRVar2[3].mask = 0x4c;
  pRVar2[3].fixed = 0;
  local_440._M_head_impl = pRVar2;
  std::
  vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
  ::
  emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
            ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
              *)__return_storage_ptr__,
             (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> *
             )&local_440);
  if (local_440._M_head_impl != (Register *)0x0) {
    (*(local_440._M_head_impl)->_vptr_Register[1])();
  }
  local_440._M_head_impl = (Register *)0x0;
  if (local_410 != local_400) {
    operator_delete(local_410);
  }
  pRVar2 = (Register *)operator_new(0x40);
  puVar5 = local_420;
  local_430 = puVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"DEBUG_L","");
  pRVar2->mask = 6;
  pRVar2->fixed = 0;
  *(undefined4 *)&pRVar2[1]._vptr_Register = 0x4000c0;
  pRVar2->_vptr_Register = (_func_int **)&PTR__SimpleMmioRegister_00345608;
  *(uint32_t **)&pRVar2[1].mask = &pRVar2[2].mask;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pRVar2[1].mask,local_430,local_430 + local_428);
  pRVar2[3].mask = 0x50;
  pRVar2[3].fixed = 0;
  local_440._M_head_impl = pRVar2;
  std::
  vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
  ::
  emplace_back<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>
            ((vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
              *)__return_storage_ptr__,
             (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> *
             )&local_440);
  puVar4 = local_430;
  if (local_440._M_head_impl != (Register *)0x0) {
    (*(local_440._M_head_impl)->_vptr_Register[1])();
    puVar4 = local_430;
  }
LAB_0017e4a1:
  local_440._M_head_impl = (Register *)0x0;
  if (puVar4 != puVar5) {
    operator_delete(puVar4);
  }
  return (vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
          *)(vector<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>,std::allocator<std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>>>
             *)__return_storage_ptr__;
}

Assistant:

std::vector<std::unique_ptr<Register>> pgraph_debug_regs(const chipset_info &chipset) {
	std::vector<std::unique_ptr<Register>> res;
	if (chipset.card_type == 1) {
		AREG(Nv1DebugARegister, 0x400080, 0x11111110);
		REG(0x400084, 0x31111101, "DEBUG_B", debug_b);
		REG(0x400088, 0x11111111, "DEBUG_C", debug_c);
	} else if (chipset.card_type == 3) {
		AREG(Nv1DebugARegister, 0x400080, 0x13311110);
		AREG(DebugBRegister, 0x400084, 0x10113301);
		REG(0x400088, 0x1133f111, "DEBUG_C", debug_c);
		REG(0x40008c, 0x1173ff31, "DEBUG_D", debug_d);
	} else if (chipset.card_type == 4) {
		bool is_nv5 = chipset.chipset >= 5;
		AREG(Nv4DebugARegister, 0x400080, 0x1337f000);
		AREG(DebugBRegister, 0x400084, (is_nv5 ? 0xf2ffb701 : 0x72113101));
		REG(0x400088, 0x11d7fff1, "DEBUG_C", debug_c);
		REG(0x40008c, (is_nv5 ? 0xfbffff73 : 0x11ffff33), "DEBUG_D", debug_d);
	} else if (chipset.card_type == 0x10) {
		bool is_nv11p = nv04_pgraph_is_nv11p(&chipset);
		bool is_nv15p = nv04_pgraph_is_nv15p(&chipset);
		bool is_nv17p = nv04_pgraph_is_nv17p(&chipset);
		// XXX DEBUG_A
		if (!is_nv11p) {
			AREG(CelsiusDebugBRegister, 0x400084, 0xfe11f701);
		} else {
			AREG(CelsiusDebugBRegister, 0x400084, 0xfe71f701);
		}
		REG(0x400088, 0xffffffff, "DEBUG_C", debug_c);
		if (!is_nv15p) {
			REG(0x40008c, 0xfffffc70, "DEBUG_D", debug_d);
		} else if (!is_nv17p) {
			REG(0x40008c, 0xffffff78, "DEBUG_D", debug_d);
		} else {
			REGF(0x40008c, 0xffffff78, "DEBUG_D", debug_d, 0x400);
		}
		if (!is_nv17p) {
			REG(0x400090, 0x00ffffff, "DEBUG_E", debug_e);
		} else {
			REG(0x400090, 0x1fffffff, "DEBUG_E", debug_e);
		}
	} else if (chipset.card_type == 0x20) {
		bool is_nv25p = nv04_pgraph_is_nv25p(&chipset);
		// XXX DEBUG_A
		AREG(DebugBRegister, 0x400084, 0x0011f7c1);
		if (!is_nv25p) {
			REG(0x40008c, 0xffffd77d, "DEBUG_D", debug_d);
			REG(0x400090, 0xfffff3ff, "DEBUG_E", debug_e);
			REG(0x400094, 0x000000ff, "DEBUG_F", debug_f);
		} else {
			REG(0x40008c, 0xffffdf7d, "DEBUG_D", debug_d);
			REG(0x400090, 0xffffffff, "DEBUG_E", debug_e);
		}
		REG(0x400098, 0xffffffff, "DEBUG_G", debug_g);
		REG(0x40009c, 0x00000fff, "DEBUG_FD_CHECK_SKIP", debug_fd_check_skip);
		if (is_nv25p) {
			REG(0x4000c0, 0x00000003, "DEBUG_L", debug_l);
		}
	} else if (chipset.card_type == 0x30) {
		// XXX DEBUG_A
		AREG(DebugBRegister, 0x400084, 0x7012f7c1);
		REG(0x40008c, 0xfffedf7d, "DEBUG_D", debug_d);
		REG(0x400090, 0x3fffffff, "DEBUG_E", debug_e);
		REG(0x400098, 0xffffffff, "DEBUG_G", debug_g);
		REG(0x40009c, 0xffffffff, "DEBUG_H", debug_h);
		REG(0x4000a0, 0xffffffff, "DEBUG_I", debug_i);
		REG(0x4000a4, 0x0000000f, "DEBUG_J", debug_j);
		REG(0x4000c0, 0x0000001e, "DEBUG_L", debug_l);
	} else {
		// XXX DEBUG_A
		AREG(DebugBRegister, 0x400084, 0x7010c7c1);
		REG(0x40008c, 0xe1fad155, "DEBUG_D", debug_d);
		REG(0x400090, 0x33ffffff, "DEBUG_E", debug_e);
		REG(0x4000a4, 0x0000000f, "DEBUG_J", debug_j);
		REG(0x4000b0, 0x0000003f, "DEBUG_K", debug_k);
		REG(0x4000c0, 0x00000006, "DEBUG_L", debug_l);
	}
	return res;
}